

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.h
# Opt level: O2

void __thiscall BackupRestaurant::~BackupRestaurant(BackupRestaurant *this)

{
  BaseAction::~BaseAction(&this->super_BaseAction);
  operator_delete(this);
  return;
}

Assistant:

virtual  ~BackupRestaurant() = default;